

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_both.cc
# Opt level: O3

bool bssl::tls13_post_handshake(SSL *ssl,SSLMessage *msg)

{
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  uint8_t key_update_request;
  CBS body;
  byte local_29;
  CBS local_28;
  
  if (msg->type != '\x18') {
    if ((msg->type == '\x04') && ((ssl->field_0xa4 & 1) == 0)) {
      bVar2 = tls13_process_new_session_ticket(ssl,msg);
      return bVar2;
    }
    ssl->s3->key_update_count = '\0';
    ssl_send_alert(ssl,2,10);
    ERR_put_error(0x10,0,0xdf,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                  ,0x2d6);
    return false;
  }
  puVar1 = &ssl->s3->key_update_count;
  *puVar1 = *puVar1 + '\x01';
  iVar3 = SSL_is_quic(ssl);
  if ((iVar3 == 0) && (ssl->s3->key_update_count < 0x21)) {
    local_28.data = (msg->body).data;
    local_28.len = (msg->body).len;
    iVar3 = CBS_get_u8(&local_28,&local_29);
    if (((iVar3 != 0) && (local_28.len == 0)) && (local_29 < 2)) {
      bVar2 = tls13_rotate_traffic_key(ssl,evp_aead_open);
      if (!bVar2) {
        return false;
      }
      if ((local_29 == 1) && (bVar2 = tls13_add_key_update(ssl,0), !bVar2)) {
        return false;
      }
      return true;
    }
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                  ,0x2b1);
    iVar3 = 0x32;
  }
  else {
    ERR_put_error(0x10,0,0x104,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                  ,0x2cb);
    iVar3 = 10;
  }
  ssl_send_alert(ssl,2,iVar3);
  return false;
}

Assistant:

bool tls13_post_handshake(SSL *ssl, const SSLMessage &msg) {
  if (msg.type == SSL3_MT_NEW_SESSION_TICKET && !ssl->server) {
    return tls13_process_new_session_ticket(ssl, msg);
  }

  if (msg.type == SSL3_MT_KEY_UPDATE) {
    ssl->s3->key_update_count++;
    if (SSL_is_quic(ssl) || ssl->s3->key_update_count > kMaxKeyUpdates) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MANY_KEY_UPDATES);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_UNEXPECTED_MESSAGE);
      return false;
    }

    return tls13_receive_key_update(ssl, msg);
  }

  ssl->s3->key_update_count = 0;

  ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_UNEXPECTED_MESSAGE);
  OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_MESSAGE);
  return false;
}